

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_voice_dir_and_voice(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  _Bool _Var2;
  char temp [260];
  char acStack_118 [264];
  
  _Var1 = set_voice_dir_path(oj,path);
  if (_Var1) {
    if (oj->fn_voice_path[0] == '\0') {
      _Var1 = set_default_voice(oj);
      return _Var1;
    }
    get_fname(oj->fn_voice_path,acStack_118);
    _Var2 = set_voice_name(oj,acStack_118);
    _Var1 = true;
    if (!_Var2) {
      _Var1 = set_default_voice(oj);
    }
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool set_voice_dir_and_voice(OpenJTalk *oj, const char *path)
{
	char temp[MAX_PATH];

	if (!set_voice_dir_path(oj, path))
	{
		return false;
	}

	if (!oj->fn_voice_path || strlen(oj->fn_voice_path) == 0)
	{
		return set_default_voice(oj);
	}

	if (get_fname(oj->fn_voice_path, temp) == NULL)
	{
		oj->errorCode = OPENJTALKERROR_PATH_STRING_IS_NULL_OR_EMPTY;
		return false;
	}

	if (set_voice_name(oj, temp))
	{
		return true;
	}

	return set_default_voice(oj);
}